

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access_block(int g_a,int idx,void *ptr,int *ld)

{
  long in_RCX;
  int in_ESI;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer iblock;
  Integer ndim;
  Integer a;
  Integer in_stack_00000180;
  Integer *in_stack_00000258;
  void *in_stack_00000260;
  Integer in_stack_00000268;
  Integer in_stack_00000270;
  int local_6c;
  undefined8 local_68 [7];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  int local_8;
  
  local_20 = (long)in_EDI;
  local_18 = in_RCX;
  local_8 = in_ESI;
  local_28 = pnga_ndim(in_stack_00000180);
  local_30 = (long)local_8;
  pnga_access_block_ptr(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  for (local_6c = 0; (long)local_6c < local_28 + -1; local_6c = local_6c + 1) {
    *(int *)(local_18 + ((local_28 - local_6c) + -2) * 4) = (int)local_68[local_6c];
  }
  return;
}

Assistant:

void NGA_Access_block(int g_a, int idx, void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer iblock = (Integer)idx;
     Integer _ga_work[MAXDIM];
     wnga_access_block_ptr(a,iblock,ptr,_ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}